

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O1

void __thiscall mdsplit::mdsplitter::find_sections(mdsplitter *this)

{
  uint uVar1;
  pointer pmVar2;
  short sVar3;
  pointer pbVar4;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  istream *piVar9;
  pointer psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  byte bVar16;
  ulong unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent_section;
  pointer pbVar17;
  string_view str;
  string_view str_00;
  mdsection new_section;
  string current_line;
  smatch sm;
  regex ignore_end_regex;
  regex ignore_begin_regex;
  regex header_regex;
  ifstream fin;
  path local_3c8;
  ulong local_3a0;
  undefined1 local_398 [8];
  _Alloc_hider _Stack_390;
  mdsplitter *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_358;
  undefined1 local_340 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  path *local_2f8;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> *local_2f0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2e8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2c0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2a0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_280;
  path local_260;
  long local_238 [65];
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_280,"(^|\\n)(#+) +(.*)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2a0," *<!-- START mdsplit-ignore --> *",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2c0," *<!-- END mdsplit-ignore --> *",0x10);
  std::ifstream::ifstream((istream *)local_238,(this->input_)._M_pathname._M_dataplus._M_p,_S_in);
  local_318._M_allocated_capacity = (size_type)&local_308;
  local_318._8_8_ = 0;
  local_308._M_local_buf[0] = '\0';
  local_2f0 = &this->sections_;
  local_2f8 = &this->output_dir_;
  local_3a0 = 0;
  bVar16 = 0;
  do {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)local_318._M_local_buf,cVar6);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_allocated_capacity != &local_308) {
        operator_delete((void *)local_318._M_allocated_capacity,
                        CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) +
                        1);
      }
      std::ifstream::~ifstream(local_238);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_2c0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_2a0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_280);
      return;
    }
    local_2e8.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8._M_begin._M_current = (char *)0x0;
    local_2e8.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar7 = is_codeblock((string *)&local_318);
    bVar16 = bVar16 ^ bVar7;
    if (bVar16 == 0) {
      local_388 = (mdsplitter *)0x0;
      aStack_380._M_allocated_capacity = 0;
      local_398 = (undefined1  [8])0x0;
      _Stack_390._M_p = (pointer)0x0;
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_318._M_allocated_capacity,
                         (char *)(local_318._8_8_ + local_318._M_allocated_capacity),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_398,&local_2a0,0);
      if (local_398 != (undefined1  [8])0x0) {
        operator_delete((void *)local_398,(long)local_388 - (long)local_398);
      }
      unaff_R14 = CONCAT71((int7)(unaff_R14 >> 8),1);
      if (!bVar7) {
        local_388 = (mdsplitter *)0x0;
        aStack_380._M_allocated_capacity = 0;
        local_398 = (undefined1  [8])0x0;
        _Stack_390._M_p = (pointer)0x0;
        bVar7 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_318._M_allocated_capacity,
                           (char *)(local_318._8_8_ + local_318._M_allocated_capacity),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_398,&local_2c0,0);
        if (local_398 != (undefined1  [8])0x0) {
          operator_delete((void *)local_398,(long)local_388 - (long)local_398);
        }
        if (!bVar7) {
          uVar8 = (uint)local_3a0;
          if ((local_3a0 & 1) == 0) {
            bVar7 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_318._M_allocated_capacity,
                               (char *)(local_318._8_8_ + local_318._M_allocated_capacity),
                               &local_2e8,&local_280,0);
            if (bVar7) {
              if (local_2e8.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_2e8.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar7 = false;
              }
              else {
                bVar7 = ((long)local_2e8.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2e8.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                        - 6U < 0xfffffffffffffffd;
              }
              psVar10 = local_2e8.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -3;
              if (bVar7) {
                psVar10 = local_2e8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2;
              }
              sVar3 = (short)*(undefined4 *)
                              &(psVar10->
                               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).second._M_current -
                      (short)*(undefined4 *)
                              &(psVar10->
                               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).first._M_current;
              if (psVar10->matched == false) {
                sVar3 = 0;
              }
              if (sVar3 <= this->max_split_level_) {
                local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffffffff0000);
                _Stack_390._M_p = (pointer)&aStack_380;
                local_388 = (mdsplitter *)0x0;
                aStack_380._M_allocated_capacity =
                     aStack_380._M_allocated_capacity & 0xffffffffffffff00;
                vStack_358.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_358.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_370.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_358.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_370.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_370.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                std::filesystem::__cxx11::path::path((path *)local_340);
                local_398._0_2_ = sVar3;
                if (local_2e8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_2e8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  bVar7 = false;
                }
                else {
                  bVar7 = ((long)local_2e8.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2e8.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555 - 7U < 0xfffffffffffffffc;
                }
                local_3c8._M_pathname._M_dataplus._M_p = (pointer)&local_3c8._M_pathname.field_2;
                _Var12._M_p = (pointer)(local_2e8.
                                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 3);
                paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_2e8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -3);
                if (bVar7) {
                  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_Var12._M_p;
                }
                if ((char)*(short *)(paVar11->_M_local_buf + 0x10) == '\x01') {
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)&local_3c8,paVar11->_M_allocated_capacity,
                             *(undefined8 *)(paVar11->_M_local_buf + 8));
                }
                else {
                  local_3c8._M_pathname._M_string_length = 0;
                  local_3c8._M_pathname.field_2._M_local_buf[0] = '\0';
                }
                std::__cxx11::string::operator=((string *)&_Stack_390,(string *)&local_3c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c8._M_pathname._M_dataplus._M_p != &local_3c8._M_pathname.field_2) {
                  operator_delete(local_3c8._M_pathname._M_dataplus._M_p,
                                  CONCAT71(local_3c8._M_pathname.field_2._M_allocated_capacity._1_7_
                                           ,local_3c8._M_pathname.field_2._M_local_buf[0]) + 1);
                }
                while ((local_388 != (mdsplitter *)0x0 &&
                       (_Var12._M_p = _Stack_390._M_p,
                       (_Stack_390._M_p + -1)[(long)local_388] == ' '))) {
                  std::__cxx11::string::pop_back();
                }
                uVar8 = (int)(short)local_398._0_2_;
                if (2 < (short)local_398._0_2_) {
                  do {
                    uVar1 = uVar8 - 1;
                    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(this->sections_).
                                 super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(this->sections_).
                                 super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                    lVar15 = (long)paVar14 - (long)paVar11 >> 9;
                    paVar13 = paVar14;
                    if (0 < lVar15) {
                      paVar13 = paVar14 + lVar15 * -0x20;
                      paVar14 = paVar14 + -0x10;
                      lVar15 = lVar15 + 1;
                      do {
                        if (uVar1 == (int)*(short *)(paVar14 + 8)) {
                          _Var12._M_p = (pointer)(ulong)(uint)(int)*(short *)(paVar14 + 8);
                          paVar14 = paVar14 + 0x10;
                          goto LAB_00124e93;
                        }
                        if (uVar1 == (int)*(short *)paVar14) {
                          _Var12._M_p = (pointer)(ulong)(uint)(int)*(short *)paVar14;
                          paVar14 = paVar14 + 8;
                          goto LAB_00124e93;
                        }
                        _Var12._M_p = (pointer)(ulong)(uint)(int)*(short *)(paVar14 + -8);
                        if (uVar1 == (int)*(short *)(paVar14 + -8)) goto LAB_00124e93;
                        if (uVar1 == (int)*(short *)(paVar14 + -0x10)) {
                          _Var12._M_p = (pointer)(ulong)(uint)(int)*(short *)(paVar14 + -0x10);
                          paVar14 = paVar14 + -8;
                          goto LAB_00124e93;
                        }
                        paVar14 = paVar14 + -0x20;
                        lVar15 = lVar15 + -1;
                      } while (1 < lVar15);
                    }
                    lVar15 = (long)paVar13 - (long)paVar11 >> 7;
                    if (lVar15 == 1) {
LAB_00124e70:
                      _Var12._M_p = (pointer)paVar13;
                      paVar14 = paVar13;
                      if (uVar1 != (int)*(short *)(paVar13 + -8)) {
                        _Var12._M_p = (pointer)paVar11;
                        paVar14 = paVar11;
                      }
                    }
                    else if (lVar15 == 2) {
LAB_00124e63:
                      _Var12._M_p = (pointer)paVar13;
                      paVar14 = paVar13;
                      if (uVar1 != (int)*(short *)(paVar13 + -8)) {
                        paVar13 = paVar13 + -8;
                        goto LAB_00124e70;
                      }
                    }
                    else {
                      _Var12._M_p = (pointer)paVar13;
                      paVar14 = paVar11;
                      if ((lVar15 == 3) &&
                         (paVar14 = paVar13, uVar1 != (int)*(short *)(paVar13 + -8))) {
                        paVar13 = paVar13 + -8;
                        goto LAB_00124e63;
                      }
                    }
LAB_00124e93:
                    if (paVar14 != paVar11) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert(&local_370,
                               (const_iterator)
                               local_370.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (value_type *)(paVar14->_M_local_buf + -0x78));
                    }
                    bVar7 = 3 < (int)uVar8;
                    uVar8 = uVar1;
                  } while (bVar7);
                }
                if ((this->sections_).
                    super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    (this->sections_).
                    super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                            (&local_260,(char (*) [9])"index.md",auto_format);
                  std::filesystem::__cxx11::operator/(&local_3c8,local_2f8,&local_260);
                  std::__cxx11::string::operator=((string *)local_340,(string *)&local_3c8);
                  _Var5._M_head_impl = local_320._M_head_impl;
                  local_320._M_head_impl =
                       (_Impl *)local_3c8._M_cmpts._M_impl._M_t.
                                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                .
                                super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                ._M_head_impl;
                  local_3c8._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                                    )0x0;
                  if (_Var5._M_head_impl != (_Impl *)0x0) {
                    std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                              ((_Impl_deleter *)&local_320,_Var5._M_head_impl);
                  }
                  std::filesystem::__cxx11::path::clear(&local_3c8);
                  std::filesystem::__cxx11::path::~path(&local_3c8);
                  std::filesystem::__cxx11::path::~path(&local_260);
                  std::__cxx11::string::_M_replace((ulong)&_Stack_390,0,(char *)local_388,0x12fea1);
                }
                else {
                  std::filesystem::__cxx11::path::operator=((path *)local_340,local_2f8);
                  pbVar4 = local_370.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar17 = local_370.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar4;
                      pbVar17 = pbVar17 + 1) {
                    str._M_str = _Var12._M_p;
                    str._M_len = (size_t)(pbVar17->_M_dataplus)._M_p;
                    slugify_abi_cxx11_(&local_3c8._M_pathname,
                                       (mdsplitter *)pbVar17->_M_string_length,str);
                    std::filesystem::__cxx11::path::_M_append
                              (local_340,local_3c8._M_pathname._M_string_length,
                               local_3c8._M_pathname._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8._M_pathname._M_dataplus._M_p != &local_3c8._M_pathname.field_2)
                    {
                      operator_delete(local_3c8._M_pathname._M_dataplus._M_p,
                                      CONCAT71(local_3c8._M_pathname.field_2._M_allocated_capacity.
                                               _1_7_,local_3c8._M_pathname.field_2._M_local_buf[0])
                                      + 1);
                    }
                  }
                  str_00._M_str = _Var12._M_p;
                  str_00._M_len = (size_t)_Stack_390._M_p;
                  slugify_abi_cxx11_(&local_3c8._M_pathname,local_388,str_00);
                  std::filesystem::__cxx11::path::_M_append
                            (local_340,local_3c8._M_pathname._M_string_length,
                             local_3c8._M_pathname._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_pathname._M_dataplus._M_p != &local_3c8._M_pathname.field_2) {
                    operator_delete(local_3c8._M_pathname._M_dataplus._M_p,
                                    CONCAT71(local_3c8._M_pathname.field_2._M_allocated_capacity.
                                             _1_7_,local_3c8._M_pathname.field_2._M_local_buf[0]) +
                                    1);
                  }
                  std::filesystem::__cxx11::path::_M_concat(local_340,3,".md");
                }
                std::filesystem::__cxx11::path::parent_path();
                std::filesystem::create_directory(&local_3c8);
                std::filesystem::__cxx11::path::~path(&local_3c8);
                std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::push_back
                          (local_2f0,(value_type *)local_398);
                std::filesystem::__cxx11::path::~path((path *)local_340);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&vStack_358);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_370);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Stack_390._M_p != &aStack_380) {
                  operator_delete(_Stack_390._M_p,aStack_380._M_allocated_capacity + 1);
                }
              }
            }
            goto LAB_00124978;
          }
          goto LAB_00124bd2;
        }
        unaff_R14 = 0;
      }
    }
    else {
LAB_00124978:
      if (((this->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_finish) && (local_318._8_8_ != 0)) {
        local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffffffff0000);
        _Stack_390._M_p = (pointer)&aStack_380;
        local_388 = (mdsplitter *)0x0;
        aStack_380._M_allocated_capacity = aStack_380._M_allocated_capacity & 0xffffffffffffff00;
        vStack_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_370.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_358.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_370.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_370.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::filesystem::__cxx11::path::path((path *)local_340);
        local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffffffff0000);
        std::__cxx11::string::_M_replace((ulong)&_Stack_390,0,(char *)local_388,0x130017);
        std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                  (&local_260,(char (*) [9])"index.md",auto_format);
        std::filesystem::__cxx11::operator/(&local_3c8,local_2f8,&local_260);
        std::__cxx11::string::operator=((string *)local_340,(string *)&local_3c8);
        _Var5._M_head_impl = local_320._M_head_impl;
        local_320._M_head_impl =
             (_Impl *)local_3c8._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl;
        local_3c8._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                )0x0;
        if ((tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             )_Var5._M_head_impl !=
            (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)0x0) {
          std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                    ((_Impl_deleter *)&local_320,_Var5._M_head_impl);
        }
        std::filesystem::__cxx11::path::clear(&local_3c8);
        std::filesystem::__cxx11::path::~path(&local_3c8);
        std::filesystem::__cxx11::path::~path(&local_260);
        std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::push_back
                  (local_2f0,(value_type *)local_398);
        std::filesystem::__cxx11::path::~path((path *)local_340);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_358);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_390._M_p != &aStack_380) {
          operator_delete(_Stack_390._M_p,aStack_380._M_allocated_capacity + 1);
        }
      }
      pmVar2 = (this->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((this->sections_).
          super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
          super__Vector_impl_data._M_start == pmVar2) {
        uVar8 = (uint)local_3a0;
LAB_00124bd2:
        unaff_R14 = (ulong)uVar8;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pmVar2[-1].lines,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_318);
        unaff_R14 = local_3a0 & 0xffffffff;
      }
    }
    if (local_2e8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e8.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_3a0 = unaff_R14 & 0xffffffff;
  } while( true );
}

Assistant:

void mdsplitter::find_sections() {
        // # some text
        std::regex header_regex{"(^|\\n)(#+) +(.*)"};

        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        /*
         * # some text
         * std::regex h1_regex{"# +(.*)"};
         * // ## some text
         * std::regex h2_regex{"## +(.*)"};
         * // ### some text
         * std::regex h3_regex{"### +(.*)"};
         */
        std::ifstream fin(input_);

        std::string current_line;
        bool inside_codeblock = false;
        bool inside_ignoreblock = false;

        while (std::getline(fin, current_line)) {
            std::smatch sm;

            if (is_codeblock(current_line)) {
                inside_codeblock = 1 - inside_codeblock;
            }

            if (!inside_codeblock) {
                if (std::regex_match(current_line, ignore_begin_regex)) {
                    inside_ignoreblock = true;
                    continue;
                } else if (std::regex_match(current_line, ignore_end_regex)) {
                    inside_ignoreblock = false;
                    continue;
                }
                if (inside_ignoreblock) {
                    continue;
                }

                bool found_header =
                    std::regex_search(current_line, sm, header_regex);
                if (found_header) {
                    short level = sm[2].length();
                    if (level <= max_split_level_) {
                        // Create new section
                        mdsection new_section;
                        new_section.level = level;
                        new_section.header_name = sm[3].str();
                        while (!new_section.header_name.empty() &&
                               new_section.header_name.back() == ' ') {
                            new_section.header_name.pop_back();
                        }

                        // Find its parent headers
                        // For each level below this section's (ignoring level
                        // 1)
                        for (int i = new_section.level - 1; i > 1; --i) {
                            // Find some section with this lower level
                            auto it = std::find_if(sections_.rbegin(),
                                                   sections_.rend(),
                                                   [&i](const mdsection &s) {
                                                       return s.level == i;
                                                   });
                            // If we found it
                            if (it != sections_.rend()) {
                                // Then this is the parent
                                new_section.parent_headers.insert(
                                    new_section.parent_headers.begin(),
                                    it->header_name);
                            }
                        }
                        bool first_section = sections_.empty();
                        if (first_section) {
                            new_section.filepath = output_dir_ / "index.md";
                            new_section.header_name = "Home";
                        } else {
                            new_section.filepath = output_dir_;
                            for (const auto &parent_section :
                                 new_section.parent_headers) {
                                new_section.filepath /= slugify(parent_section);
                            }
                            new_section.filepath /=
                                slugify(new_section.header_name);
                            new_section.filepath += ".md";
                        }
                        fs::create_directory(
                            new_section.filepath.parent_path());
                        sections_.push_back(new_section);
                    }
                }
            }

            // Make sure there's at least one default section
            bool found_text_before_any_section = sections_.empty();
            if (found_text_before_any_section && !current_line.empty()) {
                mdsection new_section;
                new_section.level = 0;
                new_section.header_name = "";
                new_section.filepath = output_dir_ / "index.md";
                sections_.push_back(new_section);
            }

            // Store line
            if (!sections_.empty()) {
                sections_.back().lines.push_back(std::move(current_line));
            }
        }
    }